

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_info::torrent_info
          (torrent_info *this,char *param_2,char *param_3,load_torrent_limits *cfg)

{
  bool bVar1;
  span<const_char> buffer;
  int in_stack_fffffffffffffed0;
  libtorrent *local_90;
  char *local_88;
  undefined1 local_80 [8];
  bdecode_node e;
  error_code ec;
  load_torrent_limits *cfg_local;
  torrent_info *this_local;
  undefined1 local_18 [8];
  span<const_char> buffer_local;
  
  local_18 = (undefined1  [8])param_2;
  buffer_local.m_ptr = param_3;
  file_storage::file_storage(&this->m_files);
  libtorrent::aux::copy_ptr<const_libtorrent::file_storage>::copy_ptr(&this->m_orig_files);
  libtorrent::aux::
  container_wrapper<libtorrent::v1_2::announce_entry,_int,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  ::container_wrapper(&this->m_urls);
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::vector
            (&this->m_web_seeds);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector(&this->m_nodes);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->m_similar_torrents);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::vector
            (&this->m_owned_similar_torrents);
  ::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&this->m_collections);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_owned_collections);
  libtorrent::aux::
  container_wrapper<libtorrent::digest32<160L>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  ::container_wrapper(&this->m_merkle_tree);
  libtorrent::aux::
  container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::container_wrapper(&this->m_piece_layers);
  boost::shared_array<char>::shared_array(&this->m_info_section);
  ::std::__cxx11::string::string((string *)&this->m_comment);
  ::std::__cxx11::string::string((string *)&this->m_created_by);
  bdecode_node::bdecode_node(&this->m_info_dict);
  this->m_creation_date = 0;
  info_hash_t::info_hash_t(&this->m_info_hash);
  this->m_piece_hashes = 0;
  this->m_info_section_size = 0;
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
  bitfield_flag(&this->m_flags);
  boost::system::error_code::error_code((error_code *)&e.m_size);
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)&local_90,(span<const_char> *)local_18);
  buffer.m_len = (difference_type)&e.m_size;
  buffer.m_ptr = local_88;
  bdecode((bdecode_node *)local_80,local_90,buffer,(error_code *)0x0,
          (int *)(ulong)(uint)cfg->max_decode_depth,cfg->max_decode_tokens,in_stack_fffffffffffffed0
         );
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&e.m_size);
  if (bVar1) {
    libtorrent::aux::throw_ex<boost::system::system_error,boost::system::error_code&>
              ((error_code *)&e.m_size);
  }
  bVar1 = parse_torrent_file(this,(bdecode_node *)local_80,(error_code *)&e.m_size,cfg);
  if (!bVar1) {
    libtorrent::aux::throw_ex<boost::system::system_error,boost::system::error_code&>
              ((error_code *)&e.m_size);
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_80);
  return;
}

Assistant:

torrent_info::torrent_info(span<char const> buffer
		, load_torrent_limits const& cfg, from_span_t)
	{
		error_code ec;
		bdecode_node e = bdecode(buffer, ec, nullptr
			, cfg.max_decode_depth, cfg.max_decode_tokens);
		if (ec) aux::throw_ex<system_error>(ec);

		if (!parse_torrent_file(e, ec, cfg))
			aux::throw_ex<system_error>(ec);

		INVARIANT_CHECK;
	}